

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

float * drwav__read_and_close_f32
                  (drwav *pWav,uint *channels,uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_uint64 dVar1;
  undefined8 *in_RCX;
  drwav *in_RDX;
  uint *in_RSI;
  long in_RDI;
  drwav_uint64 samplesRead;
  float *pSampleData;
  drwav_uint64 sampleDataSize;
  float *in_stack_ffffffffffffffb8;
  drwav_uint64 in_stack_ffffffffffffffc0;
  drwav *local_8;
  
  local_8 = (drwav *)malloc(*(long *)(in_RDI + 0x198) << 2);
  if (local_8 == (drwav *)0x0) {
    drwav_uninit(in_RDX);
    local_8 = (drwav *)0x0;
  }
  else {
    dVar1 = drwav_read_f32(local_8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (dVar1 == *(drwav_uint64 *)(in_RDI + 0x198)) {
      drwav_uninit(in_RDX);
      if (in_RDX != (drwav *)0x0) {
        *(undefined4 *)&in_RDX->onRead = *(undefined4 *)(in_RDI + 0x4c);
      }
      if (in_RSI != (uint *)0x0) {
        *in_RSI = (uint)*(ushort *)(in_RDI + 0x50);
      }
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = *(undefined8 *)(in_RDI + 0x198);
      }
    }
    else {
      free(local_8);
      drwav_uninit(in_RDX);
      local_8 = (drwav *)0x0;
    }
  }
  return (float *)local_8;
}

Assistant:

float* drwav__read_and_close_f32(drwav* pWav, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    drwav_assert(pWav != NULL);

    drwav_uint64 sampleDataSize = pWav->totalSampleCount * sizeof(float);
    if (sampleDataSize > DRWAV_SIZE_MAX) {
        drwav_uninit(pWav);
        return NULL;    // File's too big.
    }

    float* pSampleData = (float*)DRWAV_MALLOC((size_t)sampleDataSize);    // <-- Safe cast due to the check above.
    if (pSampleData == NULL) {
        drwav_uninit(pWav);
        return NULL;    // Failed to allocate memory.
    }

    drwav_uint64 samplesRead = drwav_read_f32(pWav, (size_t)pWav->totalSampleCount, pSampleData);
    if (samplesRead != pWav->totalSampleCount) {
        DRWAV_FREE(pSampleData);
        drwav_uninit(pWav);
        return NULL;    // There was an error reading the samples.
    }

    drwav_uninit(pWav);

    if (sampleRate) *sampleRate = pWav->sampleRate;
    if (channels) *channels = pWav->channels;
    if (totalSampleCount) *totalSampleCount = pWav->totalSampleCount;
    return pSampleData;
}